

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void Catch::anon_unknown_1::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  bool bVar1;
  string *msg;
  ReusableStringStream *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  
  bVar1 = isReservedTag(in_stack_ffffffffffffff80);
  if (!bVar1) {
    return;
  }
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
  msg = (string *)
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_ffffffffffffff80,
                   (char (*) [12])in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_ffffffffffffff80,
             (char (*) [19])in_stack_ffffffffffffff78);
  pRVar2 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)in_stack_ffffffffffffff80,
                      (char (*) [66])in_stack_ffffffffffffff78);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(SourceLineInfo *)in_stack_ffffffffffffff78);
  ReusableStringStream::str_abi_cxx11_(pRVar2);
  throw_domain_error(msg);
}

Assistant:

void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
            CATCH_ENFORCE( !isReservedTag(tag),
                          "Tag name: [" << tag << "] is not allowed.\n"
                          << "Tag names starting with non alphanumeric characters are reserved\n"
                          << _lineInfo );
        }